

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O0

void write_c_symtab(Elf64_Sym *sym,char *strtab,Elf64_Addr so_addr,size_t sym_cnt,uint8_t header,
                   lj_wbuf *buf)

{
  lj_wbuf *buf_00;
  ulong in_RCX;
  long in_RSI;
  long in_RDI;
  char *sym_name;
  Elf64_Word sym_index;
  undefined7 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbf;
  undefined4 local_34;
  
  for (local_34 = 1; local_34 < in_RCX; local_34 = local_34 + 1) {
    if (((*(byte *)(in_RDI + (ulong)local_34 * 0x18 + 4) & 0xf) == 2) &&
       (*(int *)(in_RDI + (ulong)local_34 * 0x18) != 0)) {
      buf_00 = (lj_wbuf *)(in_RSI + (ulong)*(uint *)(in_RDI + (ulong)local_34 * 0x18));
      lj_wbuf_addbyte(buf_00,in_stack_ffffffffffffffbf);
      lj_wbuf_addu64(buf_00,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      lj_wbuf_addstring(buf_00,(char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                       );
    }
  }
  return;
}

Assistant:

static void write_c_symtab(ElfW(Sym *) sym, char *strtab, ElfW(Addr) so_addr,
			   size_t sym_cnt, const uint8_t header,
			   struct lj_wbuf *buf)
{
  /*
  ** Index 0 in ELF symtab is used to represent undefined symbols. Hence, we
  ** can just start with index 1.
  **
  ** For more information, see:
  ** https://docs.oracle.com/cd/E23824_01/html/819-0690/chapter6-79797.html
  */

  ElfW(Word) sym_index;
  for (sym_index = 1; sym_index < sym_cnt; sym_index++) {
    /*
    ** ELF32_ST_TYPE and ELF64_ST_TYPE are the same, so we can use
    ** ELF32_ST_TYPE for both 64-bit and 32-bit ELFs.
    **
    ** For more, see https://github.com/torvalds/linux/blob/9137eda53752ef73148e42b0d7640a00f1bc96b1/include/uapi/linux/elf.h#L135
    */
    if (ELF32_ST_TYPE(sym[sym_index].st_info) == STT_FUNC &&
        sym[sym_index].st_name != 0) {
      char *sym_name = &strtab[sym[sym_index].st_name];
      lj_wbuf_addbyte(buf, header);
      lj_wbuf_addu64(buf, sym[sym_index].st_value + so_addr);
      lj_wbuf_addstring(buf, sym_name);
    }
  }
}